

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_10203e::JsonBoolean::JsonBoolean(JsonBoolean *this)

{
  testing::Test::Test((Test *)this);
  (this->super_Json).super_Test._vptr_Test = (_func_int **)&PTR__JsonBoolean_001bddd0;
  testing::StrictMock<mock_json_callbacks>::StrictMock(&this->callbacks_);
  (this->proxy_).original_ = &(this->callbacks_).super_mock_json_callbacks;
  return;
}

Assistant:

JsonBoolean ()
                : proxy_{callbacks_} {}